

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedBitDecoder.cpp
# Opt level: O2

string * __thiscall
ZXing::OneD::DataBar::DecodeAI0139yx_abi_cxx11_
          (string *__return_storage_ptr__,DataBar *this,BitArrayView *bits,char y)

{
  int __val;
  uint uVar1;
  undefined3 in_register_00000009;
  int len;
  BitArrayView *bits_00;
  BitArrayView *extraout_RDX;
  BitArrayView *extraout_RDX_00;
  BitArrayView *bits_01;
  string trailer;
  string buffer;
  
  len = CONCAT31(in_register_00000009,y);
  BitArrayView::skipBits((BitArrayView *)this,2);
  DecodeAI01GTIN_abi_cxx11_(&buffer,this,bits_00);
  std::__cxx11::string::append((char *)&buffer);
  std::__cxx11::string::push_back((char)&buffer);
  __val = BitArrayView::readBits((BitArrayView *)this,2);
  std::__cxx11::to_string(&trailer,__val);
  std::__cxx11::string::append((string *)&buffer);
  std::__cxx11::string::~string((string *)&trailer);
  bits_01 = extraout_RDX;
  if ((char)bits == '3') {
    uVar1 = BitArrayView::readBits((BitArrayView *)this,10);
    ToString<int,void>(&trailer,(ZXing *)(ulong)uVar1,3,len);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&trailer);
    bits_01 = extraout_RDX_00;
  }
  DecodeGeneralPurposeBits_abi_cxx11_(&trailer,this,bits_01);
  if (trailer._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::operator+(__return_storage_ptr__,&buffer,&trailer);
  }
  std::__cxx11::string::~string((string *)&trailer);
  std::__cxx11::string::~string((string *)&buffer);
  return __return_storage_ptr__;
}

Assistant:

static std::string DecodeAI0139yx(BitArrayView& bits, char y)
{
	bits.skipBits(2); // Variable length symbol bit field

	std::string buffer = DecodeAI01GTIN(bits);
	buffer.append("39");
	buffer.push_back(y);
	buffer.append(std::to_string(bits.readBits(2)));

	if (y == '3')
		buffer.append(ToString(bits.readBits(10), 3));

	auto trailer = DecodeGeneralPurposeBits(bits);
	if (trailer.empty())
		return {};

	return buffer + trailer;
}